

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AddUtility(cmTarget *this,string *u,cmMakefile *makefile)

{
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  cmListFileBacktrace local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  local_60;
  
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->Utilities,u);
  if ((makefile != (cmMakefile *)0x0) &&
     (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    cmMakefile::GetBacktrace(&local_80,makefile);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
    ::pair<cmListFileBacktrace,_true>(&local_60,u,&local_80);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmListFileBacktrace>,std::_Select1st<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,cmListFileBacktrace>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmListFileBacktrace>,std::_Select1st<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>>
                *)&this->UtilityBacktraces,&local_60);
    cmListFileBacktrace::~cmListFileBacktrace(&local_60.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    cmListFileBacktrace::~cmListFileBacktrace(&local_80);
  }
  return;
}

Assistant:

void cmTarget::AddUtility(const std::string& u, cmMakefile* makefile)
{
  if (this->Utilities.insert(u).second && makefile) {
    this->UtilityBacktraces.insert(
      std::make_pair(u, makefile->GetBacktrace()));
  }
}